

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stencil_strips.cpp
# Opt level: O0

void compute_dim_order(int num_dims,int max_dim,int *dim_order)

{
  int i;
  int *dim_order_local;
  int max_dim_local;
  int num_dims_local;
  
  for (i = 0; i < num_dims; i = i + 1) {
    if (i < max_dim) {
      dim_order[i] = i;
    }
    else {
      dim_order[i] = i + 1;
    }
  }
  dim_order[num_dims + -1] = max_dim;
  return;
}

Assistant:

void compute_dim_order(int num_dims, int max_dim, int *dim_order) {
  for (int i = 0; i < num_dims; i++) {
	if (i < max_dim) {
	  dim_order[i] = i;
	} else {
	  dim_order[i] = i + 1;
	}
  }
  dim_order[num_dims - 1] = max_dim;
}